

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

PipelineResourceLayoutDescX * __thiscall
Diligent::PipelineResourceLayoutDescX::SyncDesc
          (PipelineResourceLayoutDescX *this,bool UpdateStrings)

{
  pointer pIVar1;
  Uint32 UVar2;
  pointer pIVar3;
  undefined7 in_register_00000031;
  iterator __begin3;
  pointer pIVar4;
  Char **ppCVar5;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar6;
  
  pIVar4 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  UVar2 = (Uint32)((ulong)((long)pIVar1 - (long)pIVar4) >> 4);
  (this->super_PipelineResourceLayoutDesc).NumVariables = UVar2;
  pIVar3 = pIVar4;
  if (UVar2 == 0) {
    pIVar3 = (pointer)0x0;
  }
  (this->super_PipelineResourceLayoutDesc).Variables = (ShaderResourceVariableDesc *)pIVar3;
  pIVar3 = (this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  UVar2 = (int)((ulong)((long)(this->ImtblSamCopy).
                              super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 3) *
          0x38e38e39;
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = UVar2;
  if (UVar2 == 0) {
    pIVar3 = (pointer)0x0;
  }
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers = pIVar3;
  if ((int)CONCAT71(in_register_00000031,UpdateStrings) != 0) {
    if (pIVar4 != pIVar1) {
      do {
        pVar6 = std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::_M_emplace<char_const*&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&this->StringPool,pIVar4,pIVar3);
        pIVar3 = pVar6._8_8_;
        *(undefined8 *)pIVar4 =
             *(undefined8 *)
              ((long)pVar6.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        pIVar4 = (pointer)&pIVar4->Desc;
      } while (pIVar4 != pIVar1);
    }
    pIVar4 = (this->ImtblSamCopy).
             super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->ImtblSamCopy).
             super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar4 != pIVar1) {
      ppCVar5 = &pIVar4->SamplerOrTextureName;
      do {
        pVar6 = std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::_M_emplace<char_const*&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&this->StringPool,ppCVar5,pIVar3);
        pIVar3 = pVar6._8_8_;
        *ppCVar5 = *(Char **)((long)pVar6.first.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ._M_cur.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             + 8);
        pIVar4 = (pointer)(ppCVar5 + 8);
        ppCVar5 = ppCVar5 + 9;
      } while (pIVar4 != pIVar1);
    }
  }
  return this;
}

Assistant:

PipelineResourceLayoutDescX& SyncDesc(bool UpdateStrings = false)
    {
        NumVariables = static_cast<Uint32>(VarCopy.size());
        Variables    = NumVariables > 0 ? VarCopy.data() : nullptr;

        NumImmutableSamplers = static_cast<Uint32>(ImtblSamCopy.size());
        ImmutableSamplers    = NumImmutableSamplers > 0 ? ImtblSamCopy.data() : nullptr;

        if (UpdateStrings)
        {
            for (auto& Var : VarCopy)
                Var.Name = StringPool.emplace(Var.Name).first->c_str();

            for (auto& Sam : ImtblSamCopy)
                Sam.SamplerOrTextureName = StringPool.emplace(Sam.SamplerOrTextureName).first->c_str();
        }

        return *this;
    }